

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

iterator __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<upb_MiniTable_const*>,absl::lts_20240722::container_internal::HashEq<upb_MiniTable_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<upb_MiniTable_const*,void>::Eq,std::allocator<upb_MiniTable_const*>>
::find_non_soo<upb_MiniTable_const*>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<upb_MiniTable_const*>,absl::lts_20240722::container_internal::HashEq<upb_MiniTable_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<upb_MiniTable_const*,void>::Eq,std::allocator<upb_MiniTable_const*>>
           *this,key_arg<const_upb_MiniTable_*> *key,size_t hash)

{
  bool bVar1;
  h2_t hash_00;
  CommonFields *common;
  ctrl_t *pcVar2;
  size_t sVar3;
  slot_type *ppuVar4;
  upb_MiniTable **ts;
  char *pcVar5;
  char *pcVar6;
  int __c;
  NonIterableBitMask<unsigned_short,_16,_0> *b;
  iterator iVar7;
  unsigned_short local_92;
  EqualElement<const_upb_MiniTable_*> local_90;
  uint32_t local_7c;
  NonIterableBitMask<unsigned_short,_16,_0> local_76;
  uint32_t i;
  BitMask<unsigned_short,_16,_0,_false> __end5;
  BitMask<unsigned_short,_16,_0,_false> __begin5;
  BitMask<unsigned_short,_16,_0,_false> *pBStack_70;
  BitMask<unsigned_short,_16,_0,_false> *__range5;
  Group g;
  ctrl_t *ctrl;
  probe_seq<16UL> seq;
  size_t hash_local;
  key_arg<const_upb_MiniTable_*> *key_local;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
  *this_local;
  
  seq.index_ = hash;
  bVar1 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
          ::is_soo((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                    *)this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!is_soo()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xdb0,
                  "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, absl::container_internal::HashEq<const upb_MiniTable *>::Hash, absl::container_internal::HashEq<const upb_MiniTable *>::Eq, std::allocator<const upb_MiniTable *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, Hash = absl::container_internal::HashEq<const upb_MiniTable *>::Hash, Eq = absl::container_internal::HashEq<const upb_MiniTable *>::Eq, Alloc = std::allocator<const upb_MiniTable *>, K = const upb_MiniTable *]"
                 );
  }
  common = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
           ::common((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                     *)this);
  probe((probe_seq<16UL> *)&ctrl,common,seq.index_);
  pcVar2 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
           ::control((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                      *)this);
  do {
    sVar3 = probe_seq<16UL>::offset((probe_seq<16UL> *)&ctrl);
    GroupSse2Impl::GroupSse2Impl((GroupSse2Impl *)&__range5,pcVar2 + sVar3);
    hash_00 = H2(seq.index_);
    i._2_2_ = (unsigned_short)GroupSse2Impl::Match((GroupSse2Impl *)&__range5,hash_00);
    pBStack_70 = (BitMask<unsigned_short,_16,_0,_false> *)((long)&i + 2);
    i._0_2_ = (unsigned_short)BitMask<unsigned_short,_16,_0,_false>::begin(pBStack_70);
    local_76.mask_ = (unsigned_short)BitMask<unsigned_short,_16,_0,_false>::end(pBStack_70);
    while( true ) {
      b = &local_76;
      bVar1 = container_internal::operator!=
                        ((BitMask<unsigned_short,_16,_0,_false> *)&i,
                         (BitMask<unsigned_short,_16,_0,_false> *)b);
      if (!bVar1) break;
      local_7c = BitMask<unsigned_short,_16,_0,_false>::operator*
                           ((BitMask<unsigned_short,_16,_0,_false> *)&i);
      local_90.rhs = key;
      local_90.eq = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                    ::eq_ref((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                              *)this);
      ppuVar4 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                ::slot_array((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                              *)this);
      sVar3 = probe_seq<16UL>::offset((probe_seq<16UL> *)&ctrl,(ulong)local_7c);
      ts = common_policy_traits<absl::lts_20240722::container_internal::FlatHashSetPolicy<upb_MiniTable_const*>,void>
           ::
           element<absl::lts_20240722::container_internal::FlatHashSetPolicy<upb_MiniTable_const*>>
                     (ppuVar4 + sVar3);
      bVar1 = hash_policy_traits<absl::lts_20240722::container_internal::FlatHashSetPolicy<upb_MiniTable_const*>,void>
              ::
              apply<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<upb_MiniTable_const*>,absl::lts_20240722::container_internal::HashEq<upb_MiniTable_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<upb_MiniTable_const*,void>::Eq,std::allocator<upb_MiniTable_const*>>::EqualElement<upb_MiniTable_const*>,upb_MiniTable_const*&,absl::lts_20240722::container_internal::FlatHashSetPolicy<upb_MiniTable_const*>>
                        (&local_90,ts);
      if (bVar1) {
        sVar3 = probe_seq<16UL>::offset((probe_seq<16UL> *)&ctrl,(ulong)local_7c);
        iVar7 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                               *)this,sVar3);
        return iVar7;
      }
      BitMask<unsigned_short,_16,_0,_false>::operator++((BitMask<unsigned_short,_16,_0,_false> *)&i)
      ;
    }
    local_92 = (unsigned_short)GroupSse2Impl::MaskEmpty((GroupSse2Impl *)&__range5);
    bVar1 = NonIterableBitMask::operator_cast_to_bool((NonIterableBitMask *)&local_92);
    if (bVar1) {
      iVar7 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
              ::end((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                     *)this);
      return iVar7;
    }
    probe_seq<16UL>::next((probe_seq<16UL> *)&ctrl);
    pcVar5 = probe_seq<16UL>::index((probe_seq<16UL> *)&ctrl,(char *)b,__c);
    pcVar6 = (char *)raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                     ::capacity((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                                 *)this);
  } while (pcVar5 <= pcVar6);
  __assert_fail("seq.index() <= capacity() && \"full table!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xdbd,
                "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, absl::container_internal::HashEq<const upb_MiniTable *>::Hash, absl::container_internal::HashEq<const upb_MiniTable *>::Eq, std::allocator<const upb_MiniTable *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, Hash = absl::container_internal::HashEq<const upb_MiniTable *>::Hash, Eq = absl::container_internal::HashEq<const upb_MiniTable *>::Eq, Alloc = std::allocator<const upb_MiniTable *>, K = const upb_MiniTable *]"
               );
}

Assistant:

iterator find_non_soo(const key_arg<K>& key, size_t hash) {
    assert(!is_soo());
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return iterator_at(seq.offset(i));
      }
      if (ABSL_PREDICT_TRUE(g.MaskEmpty())) return end();
      seq.next();
      assert(seq.index() <= capacity() && "full table!");
    }
  }